

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamResource.cpp
# Opt level: O0

bool __thiscall StreamResource::load(StreamResource *this)

{
  ulong uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  long in_RDI;
  bool local_1;
  
  uVar1 = al_is_audio_installed();
  if ((uVar1 & 1) == 0) {
    uVar2 = std::__cxx11::string::c_str();
    debug_message("Skipped loading stream %s\n",uVar2);
    local_1 = true;
  }
  else {
    uVar2 = std::__cxx11::string::c_str();
    uVar2 = al_load_audio_stream(uVar2,4,0x400);
    *(undefined8 *)(in_RDI + 8) = uVar2;
    if (*(long *)(in_RDI + 8) == 0) {
      debug_message("Error creating stream\n");
      local_1 = false;
    }
    else {
      al_set_audio_stream_playing(*(undefined8 *)(in_RDI + 8),0);
      al_set_audio_stream_playmode(*(undefined8 *)(in_RDI + 8),0x101);
      uVar2 = *(undefined8 *)(in_RDI + 8);
      uVar3 = al_get_default_mixer();
      al_attach_audio_stream_to_mixer(uVar2,uVar3);
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool StreamResource::load(void)
{
   if (!al_is_audio_installed()) {
      debug_message("Skipped loading stream %s\n", filename.c_str());
      return true;
   }

   stream = al_load_audio_stream(filename.c_str(), 4, 1024);
   if (!stream) {
       debug_message("Error creating stream\n");
       return false;
   }

   al_set_audio_stream_playing(stream, false);
   al_set_audio_stream_playmode(stream, ALLEGRO_PLAYMODE_LOOP);
   al_attach_audio_stream_to_mixer(stream, al_get_default_mixer());

   return true;
}